

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseStats::~TestCaseStats(TestCaseStats *this)

{
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_0016d0f0;
  std::__cxx11::string::~string((string *)&this->stdErr);
  std::__cxx11::string::~string((string *)&this->stdOut);
  TestCaseInfo::~TestCaseInfo(&this->testInfo);
  return;
}

Assistant:

TestCaseStats::~TestCaseStats() {}